

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O1

TRef fold_kfold_fpcall2(jit_State *J)

{
  IRIns *pIVar1;
  TRef TVar2;
  long lVar3;
  long lVar4;
  uint64_t u64;
  
  lVar3 = (long)(short)(J->fold).left[0].field_0.op1;
  if ((-1 < lVar3) && (lVar4 = (long)(short)(J->fold).left[0].field_0.op2, -1 < lVar4)) {
    pIVar1 = (J->cur).ir;
    u64 = (*lj_ir_callinfo[(J->fold).ins.field_0.op2].func)(pIVar1[lVar3 + 1],pIVar1[lVar4 + 1]);
    TVar2 = lj_ir_knum_u64(J,u64);
    return TVar2;
  }
  return 0;
}

Assistant:

LJFOLD(CALLN CARG IRCALL_atan2)
LJFOLDF(kfold_fpcall2)
{
  if (irref_isk(fleft->op1) && irref_isk(fleft->op2)) {
    const CCallInfo *ci = &lj_ir_callinfo[fins->op2];
    double a = ir_knum(IR(fleft->op1))->n;
    double b = ir_knum(IR(fleft->op2))->n;
    double y = ((double (*)(double, double))ci->func)(a, b);
    return lj_ir_knum(J, y);
  }
  return NEXTFOLD;
}